

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_02_ISXD.cpp
# Opt level: O1

h__Reader * __thiscall AS_02::ISXD::MXFReader::h__Reader::OpenRead(h__Reader *this,string *filename)

{
  list *plVar1;
  long *****ppppplVar2;
  ILogSink *pIVar3;
  long *****ppppplVar4;
  InterchangeObject *tmp_iobj;
  list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_> ObjectList
  ;
  Result_t result;
  long ****local_1d8;
  long ****local_1d0;
  undefined8 local_1c8;
  undefined1 local_1c0 [208];
  Result_t local_f0 [104];
  Result_t local_88 [104];
  
  h__AS02Reader::OpenMXFRead((h__AS02Reader *)local_1c0,filename);
  if (-1 < (int)local_1c0._0_4_) {
    ASDCP::Dictionary::Type((MDD_t)filename->_M_string_length);
    plVar1 = (list *)((filename->field_2)._M_local_buf + 8);
    ASDCP::MXF::OP1aHeader::GetMDObjectByType((uchar *)local_88,(InterchangeObject **)plVar1);
    Kumu::Result_t::~Result_t(local_88);
    pIVar3 = (ILogSink *)Kumu::DefaultLogSink();
    Kumu::ILogSink::Error(pIVar3,"ISXDDataEssenceDescriptor not found.\n");
    ASDCP::Dictionary::Type((MDD_t)filename->_M_string_length);
    ASDCP::MXF::OP1aHeader::GetMDObjectByType((uchar *)local_f0,(InterchangeObject **)plVar1);
    Kumu::Result_t::~Result_t(local_f0);
    local_1d8 = (long ****)&local_1d8;
    local_1c8 = 0;
    local_1d0 = local_1d8;
    ASDCP::Dictionary::Type((MDD_t)filename->_M_string_length);
    ASDCP::MXF::OP1aHeader::GetMDObjectsByType(local_1c0 + 0x68,plVar1);
    Kumu::Result_t::~Result_t((Result_t *)(local_1c0 + 0x68));
    ppppplVar4 = (long *****)local_1d8;
    if ((long *****)local_1d8 == &local_1d8) {
      pIVar3 = (ILogSink *)Kumu::DefaultLogSink();
      Kumu::ILogSink::Error(pIVar3,"MXF Metadata contains no Track Sets.\n");
      Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)RESULT_AS02_FORMAT);
      ppppplVar4 = (long *****)local_1d8;
      while (ppppplVar4 != &local_1d8) {
        ppppplVar2 = (long *****)*ppppplVar4;
        operator_delete(ppppplVar4,0x18);
        ppppplVar4 = ppppplVar2;
      }
      goto LAB_00142231;
    }
    do {
      ppppplVar2 = (long *****)*ppppplVar4;
      operator_delete(ppppplVar4,0x18);
      ppppplVar4 = ppppplVar2;
    } while (ppppplVar2 != &local_1d8);
  }
  Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)local_1c0);
LAB_00142231:
  Kumu::Result_t::~Result_t((Result_t *)local_1c0);
  return this;
}

Assistant:

Result_t
AS_02::ISXD::MXFReader::h__Reader::OpenRead(const std::string& filename)
{
  Result_t result = OpenMXFRead(filename);

  if( KM_SUCCESS(result) )
    {
      InterchangeObject* tmp_iobj = 0;

      m_HeaderPart.GetMDObjectByType(OBJ_TYPE_ARGS(ISXDDataEssenceDescriptor), &tmp_iobj);

      if ( tmp_iobj == 0 )
	{
	  DefaultLogSink().Error("ISXDDataEssenceDescriptor not found.\n");
	}

      m_HeaderPart.GetMDObjectByType(OBJ_TYPE_ARGS(ISXDDataEssenceDescriptor), &tmp_iobj);

      std::list<InterchangeObject*> ObjectList;
      m_HeaderPart.GetMDObjectsByType(OBJ_TYPE_ARGS(Track), ObjectList);

      if ( ObjectList.empty() )
	{
	  DefaultLogSink().Error("MXF Metadata contains no Track Sets.\n");
	  return RESULT_AS02_FORMAT;
	}
    }


  return result;
}